

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_Histogram(HistogramForm1 Histogram)

{
  uint *puVar1;
  byte value;
  uint uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  Image image;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&histogram,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&image,value,0,0,(ImageTemplate<unsigned_char> *)&histogram);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)&histogram);
  (*Histogram)(&histogram,&image);
  if ((long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == 0x400) {
    puVar1 = histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + value;
    uVar2 = 0;
    if (*puVar1 == image._height * image._width) {
      for (; histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start !=
             histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
          histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1) {
        uVar2 = uVar2 + *histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      }
      uVar2 = (uint)(uVar2 == *puVar1);
    }
  }
  else {
    uVar2 = 0;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
  return SUB41(uVar2,0);
}

Assistant:

bool form1_Histogram(HistogramForm1 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        const std::vector < uint32_t > histogram = Histogram( image );

        return histogram.size() == 256u && histogram[intensity] == image.width() * image.height() &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == image.width() * image.height();
    }